

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

GLFWbool parseMapping(_GLFWmapping *mapping,char *string)

{
  char *guid;
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  long lVar12;
  char *pcVar13;
  byte bVar14;
  anon_struct_16_2_6ab6935c fields [22];
  char *local_1a8;
  undefined8 uStack_1a0;
  char *local_198 [3];
  _GLFWmapelement *local_180;
  char *local_178;
  _GLFWmapelement *local_170;
  char *local_168;
  _GLFWmapelement *local_160;
  char *local_158;
  _GLFWmapelement *local_150;
  char *local_148;
  _GLFWmapelement *local_140;
  char *local_138;
  _GLFWmapelement *local_130;
  char *local_128;
  _GLFWmapelement *local_120;
  char *local_118;
  _GLFWmapelement *local_110;
  char *local_108;
  _GLFWmapelement *local_100;
  char *local_f8;
  _GLFWmapelement *local_f0;
  char *local_e8;
  _GLFWmapelement *local_e0;
  char *local_d8;
  _GLFWmapelement *local_d0;
  char *local_c8;
  _GLFWmapelement *local_c0;
  char *local_b8;
  _GLFWmapelement *local_b0;
  char *local_a8;
  _GLFWmapelement *local_a0;
  char *local_98;
  _GLFWmapelement *local_90;
  char *local_88;
  _GLFWmapelement *local_80;
  char *local_78;
  _GLFWmapelement *local_70;
  char *local_68;
  _GLFWmapelement *local_60;
  char *local_58;
  _GLFWmapelement *local_50;
  char *local_48;
  _GLFWmapelement *local_40;
  
  local_198[0] = "platform";
  local_198[1] = (char *)0x0;
  local_198[2] = "a";
  local_180 = mapping->buttons;
  local_178 = "b";
  local_170 = mapping->buttons + 1;
  local_168 = "x";
  local_160 = mapping->buttons + 2;
  local_158 = "y";
  local_150 = mapping->buttons + 3;
  local_148 = "back";
  local_140 = mapping->buttons + 6;
  local_138 = "start";
  local_130 = mapping->buttons + 7;
  local_128 = "guide";
  local_120 = mapping->buttons + 8;
  local_118 = "leftshoulder";
  local_110 = mapping->buttons + 4;
  local_108 = "rightshoulder";
  local_100 = mapping->buttons + 5;
  local_f8 = "leftstick";
  local_f0 = mapping->buttons + 9;
  local_e8 = "rightstick";
  local_e0 = mapping->buttons + 10;
  local_d8 = "dpup";
  local_d0 = mapping->buttons + 0xb;
  local_c8 = "dpright";
  local_c0 = mapping->buttons + 0xc;
  local_b8 = "dpdown";
  local_b0 = mapping->buttons + 0xd;
  local_a8 = "dpleft";
  local_a0 = mapping->buttons + 0xe;
  local_98 = "lefttrigger";
  local_70 = mapping->axes;
  local_90 = mapping->axes + 4;
  local_88 = "righttrigger";
  local_80 = mapping->axes + 5;
  local_78 = "leftx";
  local_68 = "lefty";
  local_60 = mapping->axes + 1;
  local_58 = "rightx";
  local_50 = mapping->axes + 2;
  local_48 = "righty";
  local_40 = mapping->axes + 3;
  local_1a8 = string;
  sVar8 = strcspn(string,",");
  if ((sVar8 == 0x20) && (string[0x20] == ',')) {
    uVar2 = *(undefined8 *)string;
    uVar3 = *(undefined8 *)(string + 8);
    uVar4 = *(undefined8 *)(string + 0x18);
    *(undefined8 *)(mapping->guid + 0x10) = *(undefined8 *)(string + 0x10);
    *(undefined8 *)(mapping->guid + 0x18) = uVar4;
    *(undefined8 *)mapping->guid = uVar2;
    *(undefined8 *)(mapping->guid + 8) = uVar3;
    pcVar13 = string + 0x21;
    local_1a8 = pcVar13;
    sVar8 = strcspn(pcVar13,",");
    if ((sVar8 < 0x80) && (pcVar13[sVar8] == ',')) {
      guid = mapping->guid;
      memcpy(mapping,pcVar13,sVar8);
      pcVar13 = pcVar13 + sVar8 + 1;
      do {
        cVar6 = *pcVar13;
        local_1a8 = pcVar13;
        if (cVar6 == '\0') {
          lVar12 = 0;
          do {
            if ((byte)(guid[lVar12] + 0xbfU) < 6) {
              guid[lVar12] = guid[lVar12] | 0x20;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x20);
          _glfwPlatformUpdateGamepadGUID(guid);
          return 1;
        }
        if (cVar6 == '+') {
          return 0;
        }
        if (cVar6 == '-') {
          return 0;
        }
        lVar12 = 8;
        do {
          pcVar1 = *(char **)((long)&uStack_1a0 + lVar12);
          sVar8 = strlen(pcVar1);
          iVar7 = strncmp(pcVar13,pcVar1,sVar8);
          if ((iVar7 == 0) && (pcVar13[sVar8] == ':')) {
            local_1a8 = pcVar13 + sVar8 + 1;
            pcVar1 = *(char **)((long)local_198 + lVar12);
            if (pcVar1 == (char *)0x0) {
              iVar7 = strncmp(local_1a8,"Linux",5);
              if (iVar7 != 0) {
                return 0;
              }
              break;
            }
            if (*local_1a8 == '-') {
              uStack_1a0._4_4_ = -1;
              local_1a8 = pcVar13 + sVar8 + 2;
              iVar7 = 0;
            }
            else {
              iVar7 = 1;
              if (*local_1a8 == '+') {
                local_1a8 = pcVar13 + sVar8 + 2;
                uStack_1a0._4_4_ = 0;
              }
              else {
                uStack_1a0._4_4_ = -1;
              }
            }
            cVar6 = *local_1a8;
            if (cVar6 == 'a') {
              bVar5 = false;
              cVar6 = '\x01';
            }
            else if (cVar6 == 'h') {
              cVar6 = '\x03';
              bVar5 = true;
            }
            else {
              if (cVar6 != 'b') break;
              cVar6 = '\x02';
              bVar5 = false;
            }
            *pcVar1 = cVar6;
            uVar9 = strtoul(local_1a8 + 1,&local_1a8,10);
            bVar14 = (byte)uVar9;
            if (bVar5) {
              uVar10 = strtoul(local_1a8 + 1,&local_1a8,10);
              bVar14 = (byte)(uVar9 << 4) | (byte)uVar10;
            }
            pcVar1[1] = bVar14;
            if (*pcVar1 == '\x01') {
              cVar6 = (char)(2 / (ulong)(uint)(iVar7 - uStack_1a0._4_4_));
              pcVar1[2] = cVar6;
              cVar11 = (char)iVar7 + (char)uStack_1a0._4_4_;
              pcVar1[3] = -cVar11;
              if (*local_1a8 == '~') {
                pcVar1[2] = -cVar6;
                pcVar1[3] = cVar11;
              }
            }
            break;
          }
          lVar12 = lVar12 + 0x10;
        } while (lVar12 != 0x168);
        pcVar13 = local_1a8;
        sVar8 = strcspn(local_1a8,",");
        pcVar13 = pcVar13 + sVar8;
        local_1a8 = pcVar13;
        sVar8 = strspn(pcVar13,",");
        pcVar13 = pcVar13 + sVar8;
      } while( true );
    }
  }
  _glfwInputError(0x10004,(char *)0x0);
  return 0;
}

Assistant:

static GLFWbool parseMapping(_GLFWmapping* mapping, const char* string)
{
    const char* c = string;
    size_t i, length;
    struct
    {
        const char* name;
        _GLFWmapelement* element;
    } fields[] =
    {
        { "platform",      NULL },
        { "a",             mapping->buttons + GLFW_GAMEPAD_BUTTON_A },
        { "b",             mapping->buttons + GLFW_GAMEPAD_BUTTON_B },
        { "x",             mapping->buttons + GLFW_GAMEPAD_BUTTON_X },
        { "y",             mapping->buttons + GLFW_GAMEPAD_BUTTON_Y },
        { "back",          mapping->buttons + GLFW_GAMEPAD_BUTTON_BACK },
        { "start",         mapping->buttons + GLFW_GAMEPAD_BUTTON_START },
        { "guide",         mapping->buttons + GLFW_GAMEPAD_BUTTON_GUIDE },
        { "leftshoulder",  mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_BUMPER },
        { "rightshoulder", mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_BUMPER },
        { "leftstick",     mapping->buttons + GLFW_GAMEPAD_BUTTON_LEFT_THUMB },
        { "rightstick",    mapping->buttons + GLFW_GAMEPAD_BUTTON_RIGHT_THUMB },
        { "dpup",          mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_UP },
        { "dpright",       mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_RIGHT },
        { "dpdown",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_DOWN },
        { "dpleft",        mapping->buttons + GLFW_GAMEPAD_BUTTON_DPAD_LEFT },
        { "lefttrigger",   mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_TRIGGER },
        { "righttrigger",  mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_TRIGGER },
        { "leftx",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_X },
        { "lefty",         mapping->axes + GLFW_GAMEPAD_AXIS_LEFT_Y },
        { "rightx",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_X },
        { "righty",        mapping->axes + GLFW_GAMEPAD_AXIS_RIGHT_Y }
    };

    length = strcspn(c, ",");
    if (length != 32 || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->guid, c, length);
    c += length + 1;

    length = strcspn(c, ",");
    if (length >= sizeof(mapping->name) || c[length] != ',')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GLFW_FALSE;
    }

    memcpy(mapping->name, c, length);
    c += length + 1;

    while (*c)
    {
        // TODO: Implement output modifiers
        if (*c == '+' || *c == '-')
            return GLFW_FALSE;

        for (i = 0;  i < sizeof(fields) / sizeof(fields[0]);  i++)
        {
            length = strlen(fields[i].name);
            if (strncmp(c, fields[i].name, length) != 0 || c[length] != ':')
                continue;

            c += length + 1;

            if (fields[i].element)
            {
                _GLFWmapelement* e = fields[i].element;
                int8_t minimum = -1;
                int8_t maximum = 1;

                if (*c == '+')
                {
                    minimum = 0;
                    c += 1;
                }
                else if (*c == '-')
                {
                    maximum = 0;
                    c += 1;
                }

                if (*c == 'a')
                    e->type = _GLFW_JOYSTICK_AXIS;
                else if (*c == 'b')
                    e->type = _GLFW_JOYSTICK_BUTTON;
                else if (*c == 'h')
                    e->type = _GLFW_JOYSTICK_HATBIT;
                else
                    break;

                if (e->type == _GLFW_JOYSTICK_HATBIT)
                {
                    const unsigned long hat = strtoul(c + 1, (char**) &c, 10);
                    const unsigned long bit = strtoul(c + 1, (char**) &c, 10);
                    e->index = (uint8_t) ((hat << 4) | bit);
                }
                else
                    e->index = (uint8_t) strtoul(c + 1, (char**) &c, 10);

                if (e->type == _GLFW_JOYSTICK_AXIS)
                {
                    e->axisScale = 2 / (maximum - minimum);
                    e->axisOffset = -(maximum + minimum);

                    if (*c == '~')
                    {
                        e->axisScale = -e->axisScale;
                        e->axisOffset = -e->axisOffset;
                    }
                }
            }
            else
            {
                length = strlen(_GLFW_PLATFORM_MAPPING_NAME);
                if (strncmp(c, _GLFW_PLATFORM_MAPPING_NAME, length) != 0)
                    return GLFW_FALSE;
            }

            break;
        }

        c += strcspn(c, ",");
        c += strspn(c, ",");
    }

    for (i = 0;  i < 32;  i++)
    {
        if (mapping->guid[i] >= 'A' && mapping->guid[i] <= 'F')
            mapping->guid[i] += 'a' - 'A';
    }

    _glfwPlatformUpdateGamepadGUID(mapping->guid);
    return GLFW_TRUE;
}